

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_entry_retriever.cpp
# Opt level: O1

optional_ptr<duckdb::SchemaCatalogEntry,_true> __thiscall
duckdb::CatalogEntryRetriever::GetSchema
          (CatalogEntryRetriever *this,string *catalog,EntryLookupInfo *schema_lookup_p,
          OnEntryNotFound on_entry_not_found)

{
  optional_ptr<duckdb::SchemaCatalogEntry,_true> result;
  EntryLookupInfo schema_lookup;
  optional_ptr<duckdb::SchemaCatalogEntry,_true> local_48;
  EntryLookupInfo local_40;
  
  EntryLookupInfo::EntryLookupInfo(&local_40,schema_lookup_p,(this->at_clause).ptr);
  local_48 = Catalog::GetSchema(this,catalog,&local_40,on_entry_not_found);
  if ((local_48.ptr != (SchemaCatalogEntry *)0x0) &&
     ((this->callback).super__Function_base._M_manager != (_Manager_type)0x0)) {
    optional_ptr<duckdb::SchemaCatalogEntry,_true>::CheckValid(&local_48);
    if ((this->callback).super__Function_base._M_manager == (_Manager_type)0x0) {
      ::std::__throw_bad_function_call();
    }
    (*(this->callback)._M_invoker)((_Any_data *)this,(CatalogEntry *)local_48.ptr);
  }
  return (optional_ptr<duckdb::SchemaCatalogEntry,_true>)local_48.ptr;
}

Assistant:

optional_ptr<SchemaCatalogEntry> CatalogEntryRetriever::GetSchema(const string &catalog,
                                                                  const EntryLookupInfo &schema_lookup_p,
                                                                  OnEntryNotFound on_entry_not_found) {
	EntryLookupInfo schema_lookup(schema_lookup_p, at_clause);
	auto result = Catalog::GetSchema(*this, catalog, schema_lookup, on_entry_not_found);
	if (!result) {
		return result;
	}
	if (callback) {
		// Call the callback if it's set
		callback(*result);
	}
	return result;
}